

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_client.c
# Opt level: O0

int proxy_client_send(proxy_client_handle *ch,proxy_msg *msg,uint8_t *buff)

{
  conn_handle *conn;
  int local_2c;
  int ret;
  proxy_client_priv *priv;
  uint8_t *buff_local;
  proxy_msg *msg_local;
  proxy_client_handle *ch_local;
  
  conn = (conn_handle *)ch->priv;
  local_2c = conn_send(conn,&msg->type,9);
  if ((-1 < local_2c) && (msg->size != 0)) {
    local_2c = conn_send(conn,buff,(ulong)msg->size);
  }
  return local_2c;
}

Assistant:

int proxy_client_send(struct proxy_client_handle *ch,
		      const struct proxy_msg *msg, const uint8_t *buff)
{
	struct proxy_client_priv *priv = ch->priv;
	int ret;

	ret = conn_send(&priv->conn, (uint8_t *)msg, sizeof(*msg));
	if (ret >= 0 && msg->size > 0)
		ret = conn_send(&priv->conn, buff, msg->size);

	return ret;
}